

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void save_waterlevel(memfile *mf)

{
  boolean bVar1;
  int local_20;
  int local_1c;
  int n;
  int i;
  bubble *b;
  memfile *mf_local;
  
  bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar1 != '\0') {
    mtag(mf,0,MTAG_WATERLEVEL);
    local_20 = 0;
    for (_n = bbubbles; _n != (bubble *)0x0; _n = _n->next) {
      local_20 = local_20 + 1;
    }
    mwrite32(mf,local_20);
    mwrite32(mf,xmin);
    mwrite32(mf,ymin);
    mwrite32(mf,xmax);
    mwrite32(mf,ymax);
    mwrite8(mf,bubble_up);
    for (_n = bbubbles; _n != (bubble *)0x0; _n = _n->next) {
      mwrite8(mf,_n->x);
      mwrite8(mf,_n->y);
      mwrite8(mf,_n->dx);
      mwrite8(mf,_n->dy);
      for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
        if (_n->bm == bmask[local_1c]) {
          mwrite8(mf,(int8_t)local_1c);
        }
      }
    }
  }
  return;
}

Assistant:

void save_waterlevel(struct memfile *mf)
{
	struct bubble *b;
	int i, n;

	if (!Is_waterlevel(&u.uz)) return;

	/*
	 * We're assuming that the number of bubbles stays constant,
	 * as we can't reasonably tag it anyway.  If they don't, we
	 * just end up with a diff that's longer than it needs to be.
	 */
	mtag(mf, 0, MTAG_WATERLEVEL);
	n = 0;
	for (b = bbubbles; b; b = b->next)
	    ++n;
	mwrite32(mf, n);
	mwrite32(mf, xmin);
	mwrite32(mf, ymin);
	mwrite32(mf, xmax);
	mwrite32(mf, ymax);
	mwrite8(mf, bubble_up);
	for (b = bbubbles; b; b = b->next) {
	    mwrite8(mf, b->x);
	    mwrite8(mf, b->y);
	    mwrite8(mf, b->dx);
	    mwrite8(mf, b->dy);
	    for (i = 0; i < SIZE(bmask); i++)
		if (b->bm == bmask[i])
		    mwrite8(mf, i);
	}
}